

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaturalLogarithmExpression.hpp
# Opt level: O2

string * __thiscall
Kandinsky::NaturalLogarithmExpression::toString_abi_cxx11_
          (string *__return_storage_ptr__,NaturalLogarithmExpression *this,bool evaluate)

{
  element_type *peVar1;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  peVar1 = (this->super_UnaryExpression).m_arg.
           super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_BaseExpression[5])(&local_30,peVar1,CONCAT71(in_register_00000011,evaluate));
  std::operator+(&local_50,"log(",&local_30);
  std::operator+(__return_storage_ptr__,&local_50,")");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string toString(bool evaluate = false) const
        {
            return "log(" + m_arg->toString(evaluate) + ")";
        }